

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wputils.c
# Opt level: O1

uint32_t WavpackUnpackSamples(WavpackContext *wpc,int32_t *buffer,uint32_t samples)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  int iVar5;
  int iVar6;
  uint32_t uVar7;
  uint uVar8;
  
  if (samples == 0) {
    uVar7 = 0;
  }
  else {
    iVar1 = (wpc->config).num_channels;
    uVar7 = 0;
    do {
      while( true ) {
        uVar4 = (wpc->stream).wphdr.block_samples;
        if (((uVar4 == 0) || (((wpc->stream).wphdr.flags & 0x800) == 0)) ||
           (uVar4 + (wpc->stream).wphdr.block_index <= (wpc->stream).sample_index)) {
          uVar4 = read_next_header(wpc->infile,&(wpc->stream).wphdr);
          if (uVar4 == 0xffffffff) {
            return uVar7;
          }
          if ((((wpc->stream).wphdr.block_samples == 0) ||
              ((wpc->stream).sample_index == (wpc->stream).wphdr.block_index)) &&
             (iVar5 = unpack_init(wpc), iVar5 == 0)) {
            return uVar7;
          }
        }
        uVar4 = (wpc->stream).wphdr.block_samples;
        if ((uVar4 != 0) && (((wpc->stream).wphdr.flags & 0x800) != 0)) break;
LAB_001b3e39:
        if (samples == 0) {
          return uVar7;
        }
      }
      uVar2 = (wpc->stream).wphdr.block_index;
      uVar3 = (wpc->stream).sample_index;
      uVar8 = uVar4 + uVar2;
      uVar4 = uVar8 - uVar3;
      if (uVar8 < uVar3 || uVar4 == 0) goto LAB_001b3e39;
      uVar8 = uVar2 - uVar3;
      if (uVar3 <= uVar2 && uVar8 != 0) {
        if (samples <= uVar8) {
          uVar8 = samples;
        }
        (wpc->stream).sample_index = uVar3 + uVar8;
        uVar7 = uVar7 + uVar8;
        samples = samples - uVar8;
        iVar5 = wpc->reduced_channels;
        if (wpc->reduced_channels == 0) {
          iVar5 = iVar1;
        }
        uVar8 = iVar5 * uVar8;
        if (uVar8 != 0) {
          memset(buffer,0,(ulong)uVar8 << 2);
          buffer = buffer + (ulong)(uVar8 - 1) + 1;
        }
        goto LAB_001b3e39;
      }
      if (samples <= uVar4) {
        uVar4 = samples;
      }
      unpack_samples(wpc,buffer,uVar4);
      iVar5 = wpc->reduced_channels;
      if (wpc->reduced_channels == 0) {
        iVar5 = iVar1;
      }
      if (((wpc->stream).sample_index ==
           (wpc->stream).wphdr.block_samples + (wpc->stream).wphdr.block_index) &&
         (iVar6 = check_crc_error(wpc), iVar6 != 0)) {
        wpc->crc_errors = wpc->crc_errors + 1;
      }
      uVar7 = uVar7 + uVar4;
      if ((wpc->stream).sample_index == wpc->total_samples) {
        return uVar7;
      }
      buffer = buffer + iVar5 * uVar4;
      samples = samples - uVar4;
    } while (samples != 0);
  }
  return uVar7;
}

Assistant:

uint32_t WavpackUnpackSamples (WavpackContext *wpc, int32_t *buffer, uint32_t samples)
{
    WavpackStream *wps = &wpc->stream;
    uint32_t bcount, samples_unpacked = 0, samples_to_unpack;
    int num_channels = wpc->config.num_channels;

    while (samples) {
        if (!wps->wphdr.block_samples || !(wps->wphdr.flags & INITIAL_BLOCK) ||
            wps->sample_index >= wps->wphdr.block_index + wps->wphdr.block_samples) {
                bcount = read_next_header (wpc->infile, &wps->wphdr);

                if (bcount == (uint32_t) -1)
                    break;

                if (!wps->wphdr.block_samples || wps->sample_index == wps->wphdr.block_index)
                    if (!unpack_init (wpc))
                        break;
        }

        if (!wps->wphdr.block_samples || !(wps->wphdr.flags & INITIAL_BLOCK) ||
            wps->sample_index >= wps->wphdr.block_index + wps->wphdr.block_samples)
                continue;

        if (wps->sample_index < wps->wphdr.block_index) {
            samples_to_unpack = wps->wphdr.block_index - wps->sample_index;

            if (samples_to_unpack > samples)
                samples_to_unpack = samples;

            wps->sample_index += samples_to_unpack;
            samples_unpacked += samples_to_unpack;
            samples -= samples_to_unpack;

            if (wpc->reduced_channels)
                samples_to_unpack *= wpc->reduced_channels;
            else
                samples_to_unpack *= num_channels;

            while (samples_to_unpack--)
                *buffer++ = 0;

            continue;
        }

        samples_to_unpack = wps->wphdr.block_index + wps->wphdr.block_samples - wps->sample_index;

        if (samples_to_unpack > samples)
            samples_to_unpack = samples;

        unpack_samples (wpc, buffer, samples_to_unpack);

        if (wpc->reduced_channels)
            buffer += samples_to_unpack * wpc->reduced_channels;
        else
            buffer += samples_to_unpack * num_channels;

        samples_unpacked += samples_to_unpack;
        samples -= samples_to_unpack;

        if (wps->sample_index == wps->wphdr.block_index + wps->wphdr.block_samples) {
            if (check_crc_error (wpc))
                wpc->crc_errors++;
        }

        if (wps->sample_index == wpc->total_samples)
            break;
    }

    return samples_unpacked;
}